

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O2

void __thiscall
ON_SubDVertexIterator::ON_SubDVertexIterator
          (ON_SubDVertexIterator *this,ON_SubD *subd,ON_SubDVertex *vertex)

{
  ON_SubDRef local_30;
  
  ON_SubDRef::ON_SubDRef(&this->m_subd_ref);
  this->m_v_current = (ON_SubDVertex *)0x0;
  this->m_vertex_index = 0;
  this->m_vertex_count = 0;
  this->m_v_first = (ON_SubDVertex *)0x0;
  this->m_v_last = (ON_SubDVertex *)0x0;
  (this->m_component_ptr).m_ptr = 0;
  ON_SubDRef::CreateReferenceForExperts(&local_30,subd);
  Internal_Init(this,&local_30,1,vertex,vertex,(ON_SubDComponentPtr)0x0);
  ON_SubDRef::~ON_SubDRef(&local_30);
  return;
}

Assistant:

ON_SubDVertexIterator::ON_SubDVertexIterator(
  const ON_SubD& subd,
  const ON_SubDVertex& vertex
  )
{
  Internal_Init(
    ON_SubDRef::CreateReferenceForExperts(subd),
    1,
    &vertex,
    &vertex,
    ON_SubDComponentPtr::Null
  );
}